

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

int ts_subtree_compare(Subtree left,Subtree right)

{
  Subtree *pSVar1;
  Subtree *pSVar2;
  int iVar3;
  ushort uVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (((ulong)left.ptr & 1) == 0) {
    uVar6 = (left.ptr)->symbol;
  }
  else {
    uVar6 = (ushort)left.data.symbol;
  }
  if (((ulong)right.ptr & 1) == 0) {
    uVar4 = (right.ptr)->symbol;
  }
  else {
    uVar4 = (ushort)right.data.symbol;
  }
  iVar3 = -1;
  if (uVar4 <= uVar6) {
    if (((ulong)left.ptr & 1) == 0) {
      if (uVar4 < (left.ptr)->symbol) {
        return 1;
      }
      uVar7 = (left.ptr)->child_count;
    }
    else {
      uVar7 = 0;
      if (uVar4 < left.data.symbol) {
        return 1;
      }
    }
    uVar5 = 0;
    if ((((ulong)right.ptr & 1) == 0) && (uVar5 = (right.ptr)->child_count, uVar7 < uVar5)) {
      return -1;
    }
    if (((ulong)left.ptr & 1) == 0) {
      uVar7 = (left.ptr)->child_count;
      iVar3 = 1;
      if ((uVar7 <= uVar5) && (iVar3 = 0, (ulong)uVar7 != 0)) {
        pSVar1 = ((left.ptr)->field_17).field_0.children;
        pSVar2 = ((right.ptr)->field_17).field_0.children;
        uVar8 = 0;
        do {
          iVar3 = ts_subtree_compare(pSVar1[uVar8],pSVar2[uVar8]);
          if (iVar3 == -1) {
            return -1;
          }
          if (iVar3 == 1) {
            return 1;
          }
          uVar8 = uVar8 + 1;
          iVar3 = 0;
        } while (uVar7 != uVar8);
      }
    }
    else {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int ts_subtree_compare(Subtree left, Subtree right) {
  if (ts_subtree_symbol(left) < ts_subtree_symbol(right)) return -1;
  if (ts_subtree_symbol(right) < ts_subtree_symbol(left)) return 1;
  if (ts_subtree_child_count(left) < ts_subtree_child_count(right)) return -1;
  if (ts_subtree_child_count(right) < ts_subtree_child_count(left)) return 1;
  for (uint32_t i = 0, n = ts_subtree_child_count(left); i < n; i++) {
    Subtree left_child = left.ptr->children[i];
    Subtree right_child = right.ptr->children[i];
    switch (ts_subtree_compare(left_child, right_child)) {
      case -1: return -1;
      case 1: return 1;
      default: break;
    }
  }
  return 0;
}